

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O2

string * ON_UTF16_to_std_string_abi_cxx11_
                   (string *__return_storage_ptr__,int bTestByteOrder,ON__UINT16 *sUTF16,
                   int sUTF16_count,uint *error_status,uint error_mask,ON__UINT32 error_code_point,
                   ON__UINT16 **sNextUTF16)

{
  ON__UINT16 OVar1;
  uint uVar2;
  ON__UINT16 *pOVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_register_0000008c;
  uint es;
  string *local_250;
  ON__UINT16 *sNextIn;
  undefined8 local_240;
  char buffer [512];
  
  local_240 = CONCAT44(in_register_0000008c,error_mask);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (sUTF16 != (ON__UINT16 *)0x0 && sUTF16_count == -1) {
    sUTF16_count = -1;
    pOVar3 = sUTF16;
    do {
      sUTF16_count = sUTF16_count + 1;
      OVar1 = *pOVar3;
      pOVar3 = pOVar3 + 1;
    } while (OVar1 != 0);
  }
  buffer[0x1ff] = '\0';
  if (error_status != (uint *)0x0) {
    *error_status = 0;
  }
  local_250 = __return_storage_ptr__;
  do {
    es = 0;
    sNextIn = (ON__UINT16 *)0x0;
    uVar2 = ON_ConvertUTF16ToUTF8
                      (bTestByteOrder,sUTF16,sUTF16_count,buffer,0x1ff,&es,(uint)local_240,
                       error_code_point,&sNextIn);
    uVar5 = (uint)((ulong)((long)sNextIn - (long)sUTF16) >> 1);
    if (sNextIn <= sUTF16) {
      uVar5 = 0;
    }
    uVar4 = 0;
    if (uVar2 < 0x200) {
      uVar4 = uVar2;
    }
    buffer[(int)uVar4] = '\0';
    if (sUTF16 == (ON__UINT16 *)0x0) {
      uVar5 = 0;
    }
    if (0x1fe < uVar2 - 1) {
      uVar2 = 0;
    }
    if ((int)uVar5 < 1) {
      uVar2 = 0;
    }
    if (((0 < (int)uVar2) &&
        (std::__cxx11::string::append((char *)local_250,(ulong)buffer), 0 < (int)uVar5)) &&
       ((es & 2) != 0)) {
      es = es & 0xfffffffd;
    }
    if (error_status != (uint *)0x0) {
      *error_status = *error_status | es;
    }
    sUTF16 = sUTF16 + (int)uVar5;
    sUTF16_count = sUTF16_count - uVar5;
    bTestByteOrder = 0;
  } while ((((es & 3) == 0 && 0 < (int)uVar5) && 0 < sUTF16_count) && 0 < (int)uVar2);
  if (sNextUTF16 != (ON__UINT16 **)0x0) {
    *sNextUTF16 = sUTF16;
  }
  return local_250;
}

Assistant:

std::string ON_UTF16_to_std_string(
  int bTestByteOrder,
  const ON__UINT16* sUTF16,
  int sUTF16_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const ON__UINT16** sNextUTF16
  ) ON_NOEXCEPT
{
  std::string str;
  char buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const ON__UINT16* sNextIn;

  if ( -1 == sUTF16_count && 0 != sUTF16 )
  {
    for ( sUTF16_count = 0; 0 != sUTF16[sUTF16_count]; sUTF16_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextIn = 0;
    int rc = ON_ConvertUTF16ToUTF8(
      bTestByteOrder, sUTF16, sUTF16_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextIn
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF16[] elements that were processed
    int in_count = ( 0 != sNextIn && 0 != sUTF16 && sNextIn > sUTF16 )
      ? static_cast<int>(sNextIn - sUTF16)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
      try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF16 += in_count;
    sUTF16_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF16_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sNextUTF16 )
    *sNextUTF16 = sUTF16;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}